

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScalableKReach.cpp
# Opt level: O1

bool __thiscall ScalableKReach::bfs(ScalableKReach *this,vertex_t s,vertex_t t)

{
  byte bVar1;
  byte bVar2;
  uint uVar3;
  pointer puVar4;
  pointer puVar5;
  uint *puVar6;
  bool bVar7;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  uint *puVar14;
  
  uVar9 = (ulong)s;
  this->back_ = 0;
  this->front_ = 0;
  puVar4 = (this->distance_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_start;
  uVar10 = (long)(this->distance_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                 ._M_impl.super__Vector_impl_data._M_finish - (long)puVar4;
  if (uVar9 < uVar10) {
    puVar4[uVar9] = '\0';
    uVar9 = this->back_;
    this->back_ = uVar9 + 1;
    puVar5 = (this->queue_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar10 = (long)(this->queue_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                   _M_impl.super__Vector_impl_data._M_finish - (long)puVar5 >> 2;
    if (uVar9 < uVar10) {
      puVar5[uVar9] = s;
      uVar12 = this->front_;
      uVar13 = (ulong)t;
      if (this->back_ != uVar12) {
        do {
          puVar4 = (this->distance_).
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start;
          uVar11 = (long)(this->distance_).
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_finish - (long)puVar4;
          uVar10 = uVar11;
          uVar9 = uVar13;
          if (uVar11 <= uVar13) goto LAB_0010929b;
          if (puVar4[uVar13] != '?') break;
          this->front_ = uVar12 + 1;
          puVar5 = (this->queue_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          uVar10 = (long)(this->queue_).
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data._M_finish - (long)puVar5 >> 2;
          uVar9 = uVar12;
          if (uVar10 <= uVar12) goto LAB_0010929b;
          uVar3 = puVar5[uVar12];
          uVar12 = (ulong)uVar3;
          uVar10 = uVar11;
          uVar9 = uVar12;
          if (uVar11 <= uVar12) goto LAB_0010929b;
          if (puVar4[uVar12] < this->k_) {
            pvVar8 = Graph::successors(this->graph_,uVar3);
            puVar6 = (pvVar8->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                     _M_impl.super__Vector_impl_data._M_finish;
            for (puVar14 = (pvVar8->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)
                           ._M_impl.super__Vector_impl_data._M_start; puVar14 != puVar6;
                puVar14 = puVar14 + 1) {
              uVar3 = *puVar14;
              uVar11 = (ulong)uVar3;
              puVar4 = (this->distance_).
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_start;
              uVar10 = (long)(this->distance_).
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_finish - (long)puVar4;
              uVar9 = uVar11;
              if (uVar10 <= uVar11) goto LAB_0010929b;
              if (((puVar4[uVar11] == '?') &&
                  (bVar7 = PartialIndex::indexed(&this->D1_,uVar3), !bVar7)) &&
                 (bVar7 = PartialIndex::indexed(&this->D2_,uVar3), !bVar7)) {
                uVar9 = uVar12;
                if (uVar10 <= uVar12) goto LAB_0010929b;
                puVar4[uVar11] = puVar4[uVar12] + '\x01';
                uVar3 = *puVar14;
                uVar9 = this->back_;
                this->back_ = uVar9 + 1;
                puVar5 = (this->queue_).
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data._M_start;
                uVar10 = (long)(this->queue_).
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_finish - (long)puVar5 >> 2;
                if (uVar10 <= uVar9) goto LAB_0010929b;
                puVar5[uVar9] = uVar3;
              }
            }
          }
          uVar12 = this->front_;
        } while (this->back_ != uVar12);
      }
      puVar4 = (this->distance_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_start;
      uVar10 = (long)(this->distance_).
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_finish - (long)puVar4;
      uVar9 = uVar13;
      if (uVar13 < uVar10) {
        bVar1 = puVar4[uVar13];
        bVar2 = this->k_;
        if (this->back_ != 0) {
          uVar12 = 0;
          do {
            puVar5 = (this->queue_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_start;
            uVar10 = (long)(this->queue_).
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                           super__Vector_impl_data._M_finish - (long)puVar5 >> 2;
            uVar9 = uVar12;
            if (uVar10 <= uVar12) goto LAB_0010929b;
            uVar9 = (ulong)puVar5[uVar12];
            puVar4 = (this->distance_).
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_start;
            uVar10 = (long)(this->distance_).
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_finish - (long)puVar4;
            if (uVar10 <= uVar9) goto LAB_0010929b;
            puVar4[uVar9] = '?';
            uVar12 = uVar12 + 1;
          } while (uVar12 < this->back_);
        }
        return bVar1 <= bVar2;
      }
    }
  }
LAB_0010929b:
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar9,
             uVar10);
}

Assistant:

bool ScalableKReach::bfs(vertex_t s, vertex_t t) const {
    back_ = 0;
    front_ = 0;
    distance_.at(s) = 0;
    queue_.at(back_++) = s;
    while (back_ != front_ && distance_.at(t) == INF8) {
        vertex_t cur = queue_.at(front_++);
        if (distance_.at(cur) >= k_) {
            continue;
        }
        for (const auto &nxt : graph_.successors(cur)) {
            if (distance_.at(nxt) == INF8 && !D1_.indexed(nxt) && !D2_.indexed(nxt)) {
                distance_.at(nxt) = distance_.at(cur) + 1;
                queue_.at(back_++) = nxt;
            }
        }
    }
    bool result = distance_.at(t) <= k_;
    for (size_t i = 0; i < back_; ++i) {
        distance_.at(queue_.at(i)) = INF8;
    }
    return result;
}